

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O0

int ffgcv(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *nulval,void *array,int *anynul,int *status)

{
  char local_4a [2];
  LONGLONG LStack_48;
  char cdummy [2];
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  int colnum_local;
  int datatype_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    LStack_48 = nelem;
    if (datatype == 1) {
      ffgcx(fptr,colnum,firstrow,firstelem,nelem,(char *)array,status);
    }
    else if (datatype == 0xb) {
      if (nulval == (void *)0x0) {
        ffgclb(fptr,colnum,firstrow,firstelem,nelem,1,1,'\0',(uchar *)array,local_4a,anynul,status);
      }
      else {
        ffgclb(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(uchar *)array,local_4a,anynul,
               status);
      }
    }
    else if (datatype == 0xc) {
      if (nulval == (void *)0x0) {
        ffgclsb(fptr,colnum,firstrow,firstelem,nelem,1,1,'\0',(char *)array,local_4a,anynul,status);
      }
      else {
        ffgclsb(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(char *)array,local_4a,anynul,
                status);
      }
    }
    else if (datatype == 0x14) {
      if (nulval == (void *)0x0) {
        ffgclui(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(unsigned_short *)array,local_4a,anynul,
                status);
      }
      else {
        ffgclui(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(unsigned_short *)array,local_4a,
                anynul,status);
      }
    }
    else if (datatype == 0x15) {
      if (nulval == (void *)0x0) {
        ffgcli(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(short *)array,local_4a,anynul,status);
      }
      else {
        ffgcli(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(short *)array,local_4a,anynul,
               status);
      }
    }
    else if (datatype == 0x1e) {
      if (nulval == (void *)0x0) {
        ffgcluk(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(uint *)array,local_4a,anynul,status);
      }
      else {
        ffgcluk(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(uint *)array,local_4a,anynul,
                status);
      }
    }
    else if (datatype == 0x1f) {
      if (nulval == (void *)0x0) {
        ffgclk(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(int *)array,local_4a,anynul,status);
      }
      else {
        ffgclk(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(int *)array,local_4a,anynul,status)
        ;
      }
    }
    else if (datatype == 0x28) {
      if (nulval == (void *)0x0) {
        ffgcluj(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(unsigned_long *)array,local_4a,anynul,
                status);
      }
      else {
        ffgcluj(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(unsigned_long *)array,local_4a,
                anynul,status);
      }
    }
    else if (datatype == 0x29) {
      if (nulval == (void *)0x0) {
        ffgclj(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(long *)array,local_4a,anynul,status);
      }
      else {
        ffgclj(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(long *)array,local_4a,anynul,status
              );
      }
    }
    else if (datatype == 0x50) {
      if (nulval == (void *)0x0) {
        ffgclujj(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(ULONGLONG *)array,local_4a,anynul,
                 status);
      }
      else {
        ffgclujj(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(ULONGLONG *)array,local_4a,anynul
                 ,status);
      }
    }
    else if (datatype == 0x51) {
      if (nulval == (void *)0x0) {
        ffgcljj(fptr,colnum,firstrow,firstelem,nelem,1,1,0,(LONGLONG *)array,local_4a,anynul,status)
        ;
      }
      else {
        ffgcljj(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(LONGLONG *)array,local_4a,anynul,
                status);
      }
    }
    else if (datatype == 0x2a) {
      if (nulval == (void *)0x0) {
        ffgcle(fptr,colnum,firstrow,firstelem,nelem,1,1,0.0,(float *)array,local_4a,anynul,status);
      }
      else {
        ffgcle(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(float *)array,local_4a,anynul,
               status);
      }
    }
    else if (datatype == 0x52) {
      if (nulval == (void *)0x0) {
        ffgcld(fptr,colnum,firstrow,firstelem,nelem,1,1,0.0,(double *)array,local_4a,anynul,status);
      }
      else {
        ffgcld(fptr,colnum,firstrow,firstelem,nelem,1,1,*nulval,(double *)array,local_4a,anynul,
               status);
      }
    }
    else if (datatype == 0x53) {
      if (nulval == (void *)0x0) {
        ffgcle(fptr,colnum,firstrow,(firstelem + -1) * 2 + 1,nelem << 1,1,1,0.0,(float *)array,
               local_4a,anynul,status);
      }
      else {
        ffgcle(fptr,colnum,firstrow,(firstelem + -1) * 2 + 1,nelem << 1,1,1,*nulval,(float *)array,
               local_4a,anynul,status);
      }
    }
    else if (datatype == 0xa3) {
      if (nulval == (void *)0x0) {
        ffgcld(fptr,colnum,firstrow,(firstelem + -1) * 2 + 1,nelem << 1,1,1,0.0,(double *)array,
               local_4a,anynul,status);
      }
      else {
        ffgcld(fptr,colnum,firstrow,(firstelem + -1) * 2 + 1,nelem << 1,1,1,*nulval,(double *)array,
               local_4a,anynul,status);
      }
    }
    else if (datatype == 0xe) {
      if (nulval == (void *)0x0) {
        ffgcll(fptr,colnum,firstrow,firstelem,nelem,1,'\0',(char *)array,local_4a,anynul,status);
      }
      else {
        ffgcll(fptr,colnum,firstrow,firstelem,nelem,1,*nulval,(char *)array,local_4a,anynul,status);
      }
    }
    else if (datatype == 0x10) {
      if (nulval == (void *)0x0) {
        local_4a[0] = '\0';
        ffgcls(fptr,colnum,firstrow,firstelem,nelem,1,local_4a,(char **)array,local_4a,anynul,status
              );
      }
      else {
        ffgcls(fptr,colnum,firstrow,firstelem,nelem,1,(char *)nulval,(char **)array,local_4a,anynul,
               status);
      }
    }
    else {
      *status = 0x19a;
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG nelem,       /* I - number of values to read                */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a table column. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of true if any pixels are undefined.
*/
{
    char cdummy[2];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (datatype == TBIT)
    {
      ffgcx(fptr, colnum, firstrow, firstelem, nelem, (char *) array, status);
    }
    else if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (unsigned char *) array, cdummy, anynul, status);
      else
       ffgclb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(unsigned char *)
              nulval, (unsigned char *) array, cdummy, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (signed char *) array, cdummy, anynul, status);
      else
       ffgclsb(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(signed char *)
              nulval, (signed char *) array, cdummy, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
               (unsigned short *) array, cdummy, anynul, status);
      else
        ffgclui(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
               *(unsigned short *) nulval,
               (unsigned short *) array, cdummy, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (short *) array, cdummy, anynul, status);
      else
        ffgcli(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(short *)
              nulval, (short *) array, cdummy, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (unsigned int *) array, cdummy, anynul, status);
      else
        ffgcluk(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
         *(unsigned int *) nulval, (unsigned int *) array, cdummy, anynul,
         status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (int *) array, cdummy, anynul, status);
      else
        ffgclk(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(int *)
            nulval, (int *) array, cdummy, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
               (unsigned long *) array, cdummy, anynul, status);
      else
        ffgcluj(fptr, colnum, firstrow, firstelem, nelem, 1, 1,
               *(unsigned long *) nulval, 
               (unsigned long *) array, cdummy, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (long *) array, cdummy, anynul, status);
      else
        ffgclj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(long *)
              nulval, (long *) array, cdummy, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (ULONGLONG *) array, cdummy, anynul, status);
      else
        ffgclujj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(ULONGLONG *)
              nulval, (ULONGLONG *) array, cdummy, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0,
              (LONGLONG *) array, cdummy, anynul, status);
      else
        ffgcljj(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(LONGLONG *)
              nulval, (LONGLONG *) array, cdummy, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0.,
              (float *) array, cdummy, anynul, status);
      else
      ffgcle(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(float *)
               nulval,(float *) array, cdummy, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 1, 0.,
              (double *) array, cdummy, anynul, status);
      else
        ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, 1, *(double *)
              nulval, (double *) array, cdummy, anynul, status);
    }
    else if (datatype == TCOMPLEX)
    {
      if (nulval == 0)
        ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
           1, 1, 0., (float *) array, cdummy, anynul, status);
      else
        ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
           1, 1, *(float *) nulval, (float *) array, cdummy, anynul, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
      if (nulval == 0)
        ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2, 
         1, 1, 0., (double *) array, cdummy, anynul, status);
      else
        ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2, 
         1, 1, *(double *) nulval, (double *) array, cdummy, anynul, status);
    }

    else if (datatype == TLOGICAL)
    {
      if (nulval == 0)
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 1, 0,
          (char *) array, cdummy, anynul, status);
      else
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, 1, *(char *) nulval,
          (char *) array, cdummy, anynul, status);
    }
    else if (datatype == TSTRING)
    {
      if (nulval == 0)
      {
        cdummy[0] = '\0';
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 1, 
             cdummy, (char **) array, cdummy, anynul, status);
      }
      else
        ffgcls(fptr, colnum, firstrow, firstelem, nelem, 1, (char *)
             nulval, (char **) array, cdummy, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}